

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
* __thiscall
ThreadContext::FindPropertyIdNoCase
          (ThreadContext *this,ScriptContext *scriptContext,CharacterBuffer<char16_t> *propertyName)

{
  bool bVar1;
  List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_20;
  CaseInvariantPropertyListWithHashCode *list;
  
  if (this->caseInvariantPropertySet == (PropertyNoCaseSetType *)0x0) {
    CreateNoCasePropertyMap(this);
  }
  bVar1 = FindExistingPropertyRecord
                    (this,propertyName,(CaseInvariantPropertyListWithHashCode **)&local_20);
  if (!bVar1) {
    local_20 = (List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)0x0;
  }
  return local_20;
}

Assistant:

JsUtil::List<const RecyclerWeakReference<Js::PropertyRecord const>*>*
ThreadContext::FindPropertyIdNoCase(Js::ScriptContext * scriptContext, JsUtil::CharacterBuffer<WCHAR> const& propertyName)
{
    if (caseInvariantPropertySet == nullptr)
    {
        this->CreateNoCasePropertyMap();
    }
    Js::CaseInvariantPropertyListWithHashCode* list;
    if (FindExistingPropertyRecord(propertyName, &list))
    {
        return list;
    }
    return nullptr;
}